

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineMultisampleImageTests.cpp
# Opt level: O2

TestStatus *
vkt::pipeline::anon_unknown_0::StorageImage::test
          (TestStatus *__return_storage_ptr__,Context *context,CaseDef *caseDef)

{
  ostringstream *this;
  int iVar1;
  DeviceInterface *vk;
  bool bVar2;
  bool bVar3;
  int iVar4;
  InstanceInterface *vki;
  VkDevice device;
  VkPhysicalDevice physDevice;
  Allocator *allocator;
  TestLog *pTVar5;
  TextureFormat TVar6;
  size_t __n;
  ulong __n_00;
  ConstPixelBufferAccess *pCVar7;
  void *__buf;
  void *__buf_00;
  void *__buf_01;
  void *__buf_02;
  void *__buf_03;
  void *__buf_04;
  void *__buf_05;
  int y;
  uint uVar8;
  TestStatus *pTVar9;
  int iVar10;
  VkDeviceSize bufferSize;
  ChannelOrder __fd;
  MessageBuilder *this_00;
  int x;
  int iVar11;
  CaseDef *caseDef_00;
  int local_6d8;
  allocator<char> local_6d2;
  allocator<char> local_6d1;
  allocator<char> local_6d0;
  allocator<char> local_6cf;
  allocator<char> local_6ce;
  allocator<char> local_6cd;
  int local_6cc;
  DeviceInterface *local_6c8;
  CaseDef *local_6c0;
  TestStatus *local_6b8;
  UniquePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> resolveImageTwoBufferAlloc;
  UniquePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> resolveImageOneBufferAlloc;
  ConstPixelBufferAccess referenceImage;
  RefBase<vk::Handle<(vk::HandleType)8>_> local_668;
  RefBase<vk::Handle<(vk::HandleType)8>_> local_648;
  string local_620;
  undefined1 local_600 [64];
  string imageName;
  ConstPixelBufferAccess actualImage;
  Vec4 local_578;
  Vec4 local_568;
  string local_558;
  string local_538;
  string local_518;
  PixelBufferAccess errorMask;
  TextureLevel errorMaskStorage;
  string local_4a8;
  string local_488;
  LogImage local_468;
  undefined1 local_3d8 [8];
  DeviceInterface *pDStack_3d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3c8 [23];
  ConstPixelBufferAccess local_250;
  ConstPixelBufferAccess local_228;
  ConstPixelBufferAccess layeredImageTwo;
  PixelBufferAccess layeredImageOne;
  MessageBuilder local_1b0;
  
  local_6b8 = __return_storage_ptr__;
  local_6c8 = Context::getDeviceInterface(context);
  vki = Context::getInstanceInterface(context);
  device = Context::getDevice(context);
  physDevice = Context::getPhysicalDevice(context);
  allocator = Context::getDefaultAllocator(context);
  __n = (size_t)caseDef->colorFormat;
  local_6c0 = caseDef;
  checkImageFormatRequirements(vki,physDevice,caseDef->numSamples,caseDef->colorFormat,0x18);
  pTVar5 = context->m_testCtx->m_log;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_600,"Description",(allocator<char> *)&actualImage);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&referenceImage,"",(allocator<char> *)&errorMaskStorage);
  tcu::LogSection::LogSection
            ((LogSection *)&local_468,(string *)local_600,(string *)&referenceImage);
  vk = local_6c8;
  tcu::LogSection::write((LogSection *)&local_468,(int)pTVar5,__buf,__n);
  this = &local_1b0.m_str;
  local_1b0.m_log = pTVar5;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)this);
  std::operator<<((ostream *)this,
                  "Rendering to a multisampled image. Image will be processed with a compute shader using OpImageRead and OpImageWrite."
                 );
  local_3d8 = (undefined1  [8])
              tcu::MessageBuilder::operator<<
                        (&local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&pDStack_3d0);
  std::operator<<((ostream *)&pDStack_3d0,
                  "Expecting the processed image to be roughly the same as the input image (deviation may occur for integer formats)."
                 );
  pTVar5 = tcu::MessageBuilder::operator<<
                     ((MessageBuilder *)local_3d8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::TestLog::endSection(pTVar5);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pDStack_3d0);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)this);
  tcu::LogSection::~LogSection((LogSection *)&local_468);
  std::__cxx11::string::~string((string *)&referenceImage);
  std::__cxx11::string::~string((string *)local_600);
  iVar10 = (local_6c0->renderSize).m_data[1];
  iVar11 = (local_6c0->renderSize).m_data[0];
  iVar1 = local_6c0->numLayers;
  TVar6 = ::vk::mapVkFormat(local_6c0->colorFormat);
  iVar4 = tcu::getPixelSize(TVar6);
  bufferSize = (VkDeviceSize)(iVar4 * iVar10 * iVar11 * iVar1);
  makeBuffer((Move<vk::Handle<(vk::HandleType)8>_> *)local_3d8,vk,device,bufferSize,2);
  local_648.m_data.deleter.m_device = (VkDevice)local_3c8[0]._0_8_;
  local_648.m_data.deleter.m_allocator = (VkAllocationCallbacks *)local_3c8[0]._8_8_;
  local_648.m_data.object.m_internal = (deUint64)local_3d8;
  local_648.m_data.deleter.m_deviceIface = pDStack_3d0;
  local_3d8._0_4_ = R;
  local_3d8._4_4_ = SNORM_INT8;
  pDStack_3d0 = (DeviceInterface *)0x0;
  local_3c8[0]._M_allocated_capacity = (VkDevice)0x0;
  local_3c8[0]._8_8_ = (VkAllocationCallbacks *)0x0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)8>_> *)local_3d8);
  bindBuffer((MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)local_3d8,vk,device,
             allocator,(VkBuffer)local_648.m_data.object.m_internal,(MemoryRequirement)0x1);
  resolveImageOneBufferAlloc.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
  m_data.ptr = (Allocation *)local_3d8;
  local_3d8._0_4_ = R;
  local_3d8._4_4_ = SNORM_INT8;
  de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::~UniqueBase
            ((UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)local_3d8);
  makeBuffer((Move<vk::Handle<(vk::HandleType)8>_> *)local_3d8,vk,device,bufferSize,2);
  local_668.m_data.deleter.m_device = (VkDevice)local_3c8[0]._0_8_;
  local_668.m_data.deleter.m_allocator = (VkAllocationCallbacks *)local_3c8[0]._8_8_;
  local_668.m_data.object.m_internal = (deUint64)local_3d8;
  local_668.m_data.deleter.m_deviceIface = pDStack_3d0;
  local_3d8._0_4_ = R;
  local_3d8._4_4_ = SNORM_INT8;
  pDStack_3d0 = (DeviceInterface *)0x0;
  local_3c8[0]._M_allocated_capacity = (VkDevice)0x0;
  local_3c8[0]._8_8_ = (VkAllocationCallbacks *)0x0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)8>_> *)local_3d8);
  bindBuffer((MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)local_3d8,vk,device,
             allocator,(VkBuffer)local_668.m_data.object.m_internal,(MemoryRequirement)0x1);
  resolveImageTwoBufferAlloc.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
  m_data.ptr = (Allocation *)local_3d8;
  local_3d8._0_4_ = R;
  local_3d8._4_4_ = SNORM_INT8;
  de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::~UniqueBase
            ((UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)local_3d8);
  zeroBuffer(vk,device,
             resolveImageOneBufferAlloc.
             super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr,
             bufferSize);
  caseDef_00 = local_6c0;
  zeroBuffer(vk,device,
             resolveImageTwoBufferAlloc.
             super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr,
             bufferSize);
  renderAndResolve(context,caseDef_00,(VkBuffer)local_648.m_data.object.m_internal,false);
  renderAndResolve(context,caseDef_00,(VkBuffer)local_668.m_data.object.m_internal,true);
  ::vk::invalidateMappedMemoryRange
            (vk,device,
             (VkDeviceMemory)
             ((resolveImageOneBufferAlloc.
               super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr)->
             m_memory).m_internal,
             (resolveImageOneBufferAlloc.
              super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr)->
             m_offset,bufferSize);
  ::vk::invalidateMappedMemoryRange
            (vk,device,
             (VkDeviceMemory)
             ((resolveImageTwoBufferAlloc.
               super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr)->
             m_memory).m_internal,
             (resolveImageTwoBufferAlloc.
              super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr)->
             m_offset,bufferSize);
  local_3d8 = (undefined1  [8])::vk::mapVkFormat(caseDef_00->colorFormat);
  tcu::PixelBufferAccess::PixelBufferAccess
            (&layeredImageOne,(TextureFormat *)local_3d8,(caseDef_00->renderSize).m_data[0],
             (caseDef_00->renderSize).m_data[1],caseDef_00->numLayers,
             (resolveImageOneBufferAlloc.
              super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr)->
             m_hostPtr);
  local_3d8 = (undefined1  [8])::vk::mapVkFormat(caseDef_00->colorFormat);
  tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
            (&layeredImageTwo,(TextureFormat *)local_3d8,(caseDef_00->renderSize).m_data[0],
             (caseDef_00->renderSize).m_data[1],caseDef_00->numLayers,
             (resolveImageTwoBufferAlloc.
              super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr)->
             m_hostPtr);
  TVar6 = (TextureFormat)context->m_testCtx->m_log;
  tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
            (&local_228,&layeredImageOne.super_ConstPixelBufferAccess);
  tcu::ConstPixelBufferAccess::ConstPixelBufferAccess(&local_250,&layeredImageTwo);
  local_568.m_data[0] = 0.0;
  local_568.m_data[1] = 1.0;
  local_568.m_data[2] = 0.0;
  local_568.m_data[3] = 1.0;
  local_578.m_data[0] = 1.0;
  local_578.m_data[1] = 0.0;
  local_578.m_data[2] = 0.0;
  local_578.m_data[3] = 1.0;
  bVar2 = ::vk::isIntFormat(caseDef_00->colorFormat);
  if (!bVar2) {
    bVar3 = ::vk::isUintFormat(caseDef_00->colorFormat);
    bVar2 = false;
    local_6c8 = (DeviceInterface *)((ulong)local_6c8 & 0xffffffff00000000);
    if (!bVar3) goto LAB_00500745;
  }
  local_6c8 = (DeviceInterface *)CONCAT44(local_6c8._4_4_,(caseDef_00->renderSize).m_data[0] * 2);
  bVar2 = true;
LAB_00500745:
  local_6d8 = 0;
  local_6cc = 0;
  do {
    if (caseDef_00->numLayers <= local_6d8) {
      local_3d8 = (undefined1  [8])TVar6;
      if (local_6cc == caseDef_00->numLayers) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&pDStack_3d0);
        std::operator<<((ostream *)&pDStack_3d0,"All rendered images are correct.");
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_3d8,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pDStack_3d0);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_3d8,"OK",(allocator<char> *)&local_1b0);
        pTVar9 = local_6b8;
        tcu::TestStatus::pass(local_6b8,(string *)local_3d8);
      }
      else {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&pDStack_3d0);
        std::operator<<((ostream *)&pDStack_3d0,"FAILED: Some rendered images were incorrect.");
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_3d8,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pDStack_3d0);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_3d8,"Rendered images are not correct",
                   (allocator<char> *)&local_1b0);
        pTVar9 = local_6b8;
        tcu::TestStatus::fail(local_6b8,(string *)local_3d8);
      }
      std::__cxx11::string::~string((string *)local_3d8);
      de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::~UniqueBase
                (&resolveImageTwoBufferAlloc.
                  super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>);
      ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::~RefBase(&local_668);
      de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::~UniqueBase
                (&resolveImageOneBufferAlloc.
                  super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>);
      ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::~RefBase(&local_648);
      return pTVar9;
    }
    tcu::getSubregion(&referenceImage,&local_228,0,0,local_6d8,(caseDef_00->renderSize).m_data[0],
                      (caseDef_00->renderSize).m_data[1],1);
    tcu::getSubregion(&actualImage,&local_250,0,0,local_6d8,(caseDef_00->renderSize).m_data[0],
                      (caseDef_00->renderSize).m_data[1],1);
    de::toString<int>((string *)local_3d8,&local_6d8);
    std::operator+(&imageName,"color layer ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3d8);
    std::__cxx11::string::~string((string *)local_3d8);
    local_3d8._0_4_ = RGB;
    local_3d8._4_4_ = UNORM_INT8;
    uVar8 = (caseDef_00->renderSize).m_data[1];
    __n_00 = (ulong)uVar8;
    tcu::TextureLevel::TextureLevel
              (&errorMaskStorage,(TextureFormat *)local_3d8,(caseDef_00->renderSize).m_data[0],uVar8
               ,1);
    tcu::TextureLevel::getAccess(&errorMask,&errorMaskStorage);
    iVar10 = 0;
    for (uVar8 = 0; (int)uVar8 < (caseDef_00->renderSize).m_data[1]; uVar8 = uVar8 + 1) {
      for (iVar11 = 0; iVar11 < (local_6c0->renderSize).m_data[0]; iVar11 = iVar11 + 1) {
        if (bVar2) {
          tcu::ConstPixelBufferAccess::getPixelInt
                    ((ConstPixelBufferAccess *)local_3d8,(int)&referenceImage,iVar11,uVar8);
          tcu::ConstPixelBufferAccess::getPixelInt
                    ((ConstPixelBufferAccess *)&local_1b0,(int)&actualImage,iVar11,uVar8);
          bVar3 = tcu::Vector<int,_4>::operator==
                            ((Vector<int,_4> *)local_3d8,(Vector<int,_4> *)&local_1b0);
          if (!bVar3) goto LAB_0050088f;
LAB_005008cb:
          __n_00 = (ulong)uVar8;
          tcu::PixelBufferAccess::setPixel(&errorMask,&local_568,iVar11,uVar8,0);
        }
        else {
LAB_0050088f:
          tcu::ConstPixelBufferAccess::getPixel
                    ((ConstPixelBufferAccess *)local_3d8,(int)&referenceImage,iVar11,uVar8);
          tcu::ConstPixelBufferAccess::getPixel
                    ((ConstPixelBufferAccess *)&local_1b0,(int)&actualImage,iVar11,uVar8);
          bVar3 = tcu::Vector<float,_4>::operator==
                            ((Vector<float,_4> *)local_3d8,(Vector<float,_4> *)&local_1b0);
          if (bVar3) goto LAB_005008cb;
          __n_00 = (ulong)uVar8;
          tcu::PixelBufferAccess::setPixel(&errorMask,&local_578,iVar11,uVar8,0);
          iVar10 = iVar10 + 1;
        }
      }
      caseDef_00 = local_6c0;
    }
    __fd = TVar6.order;
    if ((int)local_6c8 < iVar10) {
      tcu::LogImageSet::LogImageSet((LogImageSet *)local_600,&imageName,&imageName);
      tcu::LogImageSet::write((LogImageSet *)local_600,__fd,__buf_00,__n_00);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_620,"Result",&local_6cd);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_518,"Result",&local_6ce);
      pCVar7 = &actualImage;
      tcu::LogImage::LogImage
                ((LogImage *)local_3d8,&local_620,&local_518,pCVar7,QP_IMAGE_COMPRESSION_MODE_BEST);
      tcu::LogImage::write((LogImage *)local_3d8,__fd,__buf_01,(size_t)pCVar7);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_538,"Reference",&local_6cf);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_488,"Reference",&local_6d0);
      pCVar7 = &referenceImage;
      tcu::LogImage::LogImage
                ((LogImage *)&local_1b0,&local_538,&local_488,pCVar7,QP_IMAGE_COMPRESSION_MODE_BEST)
      ;
      tcu::LogImage::write((LogImage *)&local_1b0,__fd,__buf_02,(size_t)pCVar7);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_558,"ErrorMask",&local_6d1);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_4a8,"Error mask",&local_6d2);
      pCVar7 = &errorMask.super_ConstPixelBufferAccess;
      tcu::LogImage::LogImage
                (&local_468,&local_558,&local_4a8,pCVar7,QP_IMAGE_COMPRESSION_MODE_BEST);
      tcu::LogImage::write(&local_468,__fd,__buf_03,(size_t)pCVar7);
      tcu::TestLog::endImageSet((TestLog *)TVar6);
      tcu::LogImage::~LogImage(&local_468);
      std::__cxx11::string::~string((string *)&local_4a8);
      std::__cxx11::string::~string((string *)&local_558);
      tcu::LogImage::~LogImage((LogImage *)&local_1b0);
      std::__cxx11::string::~string((string *)&local_488);
      std::__cxx11::string::~string((string *)&local_538);
      tcu::LogImage::~LogImage((LogImage *)local_3d8);
      std::__cxx11::string::~string((string *)&local_518);
      std::__cxx11::string::~string((string *)&local_620);
      this_00 = (MessageBuilder *)local_600;
    }
    else {
      tcu::LogImageSet::LogImageSet((LogImageSet *)&local_1b0,&imageName,&imageName);
      tcu::LogImageSet::write((LogImageSet *)&local_1b0,__fd,__buf_04,__n_00);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_468,"Result",(allocator<char> *)&local_620);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_600,"Result",(allocator<char> *)&local_518);
      pCVar7 = &actualImage;
      tcu::LogImage::LogImage
                ((LogImage *)local_3d8,&local_468.m_name,(string *)local_600,pCVar7,
                 QP_IMAGE_COMPRESSION_MODE_BEST);
      tcu::LogImage::write((LogImage *)local_3d8,__fd,__buf_05,(size_t)pCVar7);
      tcu::TestLog::endImageSet((TestLog *)TVar6);
      local_6cc = local_6cc + 1;
      tcu::LogImage::~LogImage((LogImage *)local_3d8);
      std::__cxx11::string::~string((string *)local_600);
      std::__cxx11::string::~string((string *)&local_468);
      this_00 = &local_1b0;
    }
    tcu::LogImageSet::~LogImageSet((LogImageSet *)this_00);
    tcu::TextureLevel::~TextureLevel(&errorMaskStorage);
    std::__cxx11::string::~string((string *)&imageName);
    local_6d8 = local_6d8 + 1;
  } while( true );
}

Assistant:

tcu::TestStatus test (Context& context, const CaseDef caseDef)
{
	const DeviceInterface&		vk					= context.getDeviceInterface();
	const InstanceInterface&	vki					= context.getInstanceInterface();
	const VkDevice				device				= context.getDevice();
	const VkPhysicalDevice		physDevice			= context.getPhysicalDevice();
	Allocator&					allocator			= context.getDefaultAllocator();

	checkImageFormatRequirements(vki, physDevice, caseDef.numSamples, caseDef.colorFormat, VK_IMAGE_USAGE_COLOR_ATTACHMENT_BIT | VK_IMAGE_USAGE_STORAGE_BIT);

	{
		tcu::TestLog& log = context.getTestContext().getLog();
		log << tcu::LogSection("Description", "")
			<< tcu::TestLog::Message << "Rendering to a multisampled image. Image will be processed with a compute shader using OpImageRead and OpImageWrite." << tcu::TestLog::EndMessage
			<< tcu::TestLog::Message << "Expecting the processed image to be roughly the same as the input image (deviation may occur for integer formats)." << tcu::TestLog::EndMessage
			<< tcu::TestLog::EndSection;
	}

	// Host-readable buffer
	const VkDeviceSize				resolveBufferSize			= caseDef.renderSize.x() * caseDef.renderSize.y() * caseDef.numLayers * tcu::getPixelSize(mapVkFormat(caseDef.colorFormat));
	const Unique<VkBuffer>			resolveImageOneBuffer		(makeBuffer(vk, device, resolveBufferSize, VK_BUFFER_USAGE_TRANSFER_DST_BIT));
	const UniquePtr<Allocation>		resolveImageOneBufferAlloc	(bindBuffer(vk, device, allocator, *resolveImageOneBuffer, MemoryRequirement::HostVisible));
	const Unique<VkBuffer>			resolveImageTwoBuffer		(makeBuffer(vk, device, resolveBufferSize, VK_BUFFER_USAGE_TRANSFER_DST_BIT));
	const UniquePtr<Allocation>		resolveImageTwoBufferAlloc	(bindBuffer(vk, device, allocator, *resolveImageTwoBuffer, MemoryRequirement::HostVisible));

	zeroBuffer(vk, device, *resolveImageOneBufferAlloc, resolveBufferSize);
	zeroBuffer(vk, device, *resolveImageTwoBufferAlloc, resolveBufferSize);

	// Render: repeat the same rendering twice to avoid non-essential API calls and layout transitions (e.g. copy).
	{
		renderAndResolve(context, caseDef, *resolveImageOneBuffer, false);	// Pass 1: render a basic multisampled image
		renderAndResolve(context, caseDef, *resolveImageTwoBuffer, true);	// Pass 2: the same but altered with a compute shader
	}

	// Verify
	{
		invalidateMappedMemoryRange(vk, device, resolveImageOneBufferAlloc->getMemory(), resolveImageOneBufferAlloc->getOffset(), resolveBufferSize);
		invalidateMappedMemoryRange(vk, device, resolveImageTwoBufferAlloc->getMemory(), resolveImageTwoBufferAlloc->getOffset(), resolveBufferSize);

		const tcu::PixelBufferAccess		layeredImageOne	(mapVkFormat(caseDef.colorFormat), caseDef.renderSize.x(), caseDef.renderSize.y(), caseDef.numLayers, resolveImageOneBufferAlloc->getHostPtr());
		const tcu::ConstPixelBufferAccess	layeredImageTwo	(mapVkFormat(caseDef.colorFormat), caseDef.renderSize.x(), caseDef.renderSize.y(), caseDef.numLayers, resolveImageTwoBufferAlloc->getHostPtr());

		// Check all layers
		if (!compareImages(context.getTestContext().getLog(), caseDef, layeredImageOne, layeredImageTwo))
			return tcu::TestStatus::fail("Rendered images are not correct");
	}

	return tcu::TestStatus::pass("OK");
}